

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O0

bool __thiscall
Simple::Lib::
ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
::disconnect(ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
             *this,size_t connection)

{
  bool local_21;
  size_t connection_local;
  ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
  *this_local;
  
  if (this->callback_ring_ == (SignalLink *)0x0) {
    local_21 = false;
  }
  else {
    local_21 = SignalLink::remove_sibling(this->callback_ring_,connection);
  }
  return local_21;
}

Assistant:

bool disconnect (size_t connection)
  {
      return callback_ring_ ? callback_ring_->remove_sibling (connection) : false;
  }